

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          PlanningUnitMADPDiscrete *this,Index johI)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint *__args;
  _func_int *p_Var1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  code *pcVar3;
  iterator iVar4;
  long lVar5;
  undefined1 auVar6 [8];
  Index t;
  int iVar7;
  Index IVar8;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar10;
  ulong uVar11;
  Index agentI;
  ulong uVar12;
  uint uVar13;
  undefined8 uStack_90;
  Index *local_88;
  ulong local_80;
  undefined1 auStack_78 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivO_vec;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivIndicesThisT;
  
  uStack_90 = 0x4075ca;
  t = GetTimeStepForJOHI(this,johI);
  local_80 = (ulong)t;
  lVar5 = -(local_80 * 4 + 0xf & 0xfffffffffffffff0);
  local_88 = (Index *)((long)&local_88 + lVar5);
  *(undefined8 *)((long)&uStack_90 + lVar5) = 0x4075f9;
  GetJointObservationHistoryArrays(this,johI,t,(Index *)((long)&local_88 + lVar5));
  auStack_78 = (undefined1  [8])0x0;
  indivO_vec.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indivO_vec.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = 0;
  while( true ) {
    p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x40761f;
    iVar7 = (*p_Var1)(this);
    if (CONCAT44(extraout_var,iVar7) <= uVar12) break;
    auStack_58 = (undefined1  [8])0x0;
    indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indivIndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407643;
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)auStack_78,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
    auVar6 = auStack_58;
    if (auStack_58 != (undefined1  [8])0x0) {
      uVar11 = (long)indivIndicesThisT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)auStack_58;
      *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407658;
      operator_delete((void *)auVar6,uVar11);
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  }
  if (t != 0) {
    uVar12 = 0;
    do {
      IVar8 = local_88[uVar12];
      pMVar2 = this->_m_madp;
      pcVar3 = *(code **)((long)*pMVar2 + 0xe8);
      *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407689;
      pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*pcVar3)(pMVar2,IVar8);
      *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407695;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,pvVar9);
      uVar13 = 0;
      while( true ) {
        p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
        *(undefined8 *)((long)&uStack_90 + lVar5) = 0x4076a1;
        iVar7 = (*p_Var1)(this);
        auVar6 = auStack_58;
        uVar11 = (ulong)uVar13;
        if (CONCAT44(extraout_var_00,iVar7) <= uVar11) break;
        uVar10 = ((long)indivO_vec.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3) *
                 -0x5555555555555555;
        if (uVar10 < uVar11 || uVar10 - uVar11 == 0) {
LAB_004077c8:
          *(undefined8 *)((long)&uStack_90 + lVar5) = 0x4077d9;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
        }
        if ((ulong)((long)indivIndicesThisT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)auStack_58 >> 2) <= uVar11)
        goto LAB_004077c8;
        this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                  ((long)auStack_78 + uVar11 * 0x18);
        __args = (uint *)((long)auStack_58 + uVar11 * 4);
        iVar4._M_current = *(uint **)(this_00 + 8);
        if (iVar4._M_current == *(uint **)(this_00 + 0x10)) {
          *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407707;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_00,iVar4,__args);
        }
        else {
          *iVar4._M_current = *__args;
          *(uint **)(this_00 + 8) = iVar4._M_current + 1;
        }
        uVar13 = uVar13 + 1;
      }
      if (auStack_58 != (undefined1  [8])0x0) {
        uVar11 = (long)indivIndicesThisT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)auStack_58;
        *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407721;
        operator_delete((void *)auVar6,uVar11);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_80);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = 0;
  while( true ) {
    p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x40774e;
    iVar7 = (*p_Var1)(this);
    uVar12 = (ulong)uVar13;
    if (CONCAT44(extraout_var_01,iVar7) <= uVar12) {
      *(undefined8 *)((long)&uStack_90 + lVar5) = 0x4077b6;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)auStack_78);
      return __return_storage_ptr__;
    }
    uVar11 = ((long)indivO_vec.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 3) *
             -0x5555555555555555;
    if (uVar11 < uVar12 || uVar11 - uVar12 == 0) break;
    pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)auStack_78 + uVar12 * 0x18);
    *(undefined8 *)((long)&uStack_90 + lVar5) = 0x407784;
    IVar8 = GetObservationHistoryIndex(this,uVar13,t,pvVar9);
    auStack_58._0_4_ = IVar8;
    iVar4._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *(undefined8 *)((long)&uStack_90 + lVar5) = 0x4077a8;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar4,
                 (uint *)auStack_58);
    }
    else {
      *iVar4._M_current = IVar8;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    uVar13 = uVar13 + 1;
  }
  *(undefined1 **)((long)&uStack_90 + lVar5) = &LAB_004077ea;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
}

Assistant:

vector<Index>
PlanningUnitMADPDiscrete::JointToIndividualObservationHistoryIndices(Index
        johI) const
{
    Index t = GetTimeStepForJOHI(johI);
    Index jo_array[t];
    GetJointObservationHistoryArrays(johI, t, jo_array );

    //convert joint observations -> indiv. observations
    vector< vector<Index> > indivO_vec;
    
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
        indivO_vec.push_back( vector<Index>() );

    for (Index ts=0; ts<t; ts++)
    {
        vector<Index> indivIndicesThisT = 
            JointToIndividualObservationIndices(jo_array[ts]);
        for (Index agentI=0; agentI<GetNrAgents(); agentI++)
            indivO_vec.at(agentI).push_back( indivIndicesThisT.at(agentI) );
    }
            
    //calculate indiv observation history index from seq. of indiv. observations
    vector<Index> ohI_vec;
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
    {
        Index this_agentOHI = GetObservationHistoryIndex(agentI, t, 
                                                     indivO_vec.at(agentI) );
        ohI_vec.push_back(this_agentOHI);
    }
    return(ohI_vec);
}